

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurl.cpp
# Opt level: O3

void TPZShapeHCurl<pzshape::TPZShapeLinear>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZShapeData *data)

{
  double **ppdVar1;
  ulong uVar2;
  int *piVar3;
  double *pdVar4;
  int iVar5;
  double *pdVar6;
  ulong uVar7;
  TPZFNMatrix<9,_double> gradX;
  TPZFMatrix<double> local_108;
  double local_78 [10];
  
  if (connectorders->fNElements != 1) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHCurl.cpp"
               ,0x19);
  }
  CalcH1ShapeOrders(connectorders,&(data->fH1ConnectOrders).super_TPZVec<int>);
  TPZShapeH1<pzshape::TPZShapeLinear>::Initialize
            (ids,&(data->fH1ConnectOrders).super_TPZVec<int>,data);
  local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)
       ((ulong)local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
               _vptr_TPZSavable._4_4_ << 0x20);
  TPZManVector<int,_20>::Resize(&data->fSideTransformationId,1,(int *)&local_108);
  iVar5 = pztopology::TPZLine::GetTransformId(2,ids);
  *(data->fSideTransformationId).super_TPZVec<int>.fStore = iVar5;
  local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_108.super_TPZMatrix<double>.super_TPZBaseMatrix._26_6_ = 0;
  local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZManVector_018896a0;
  uVar2 = connectorders->fNElements;
  ppdVar1 = &local_108.fElem;
  if ((long)uVar2 < 0x1c) {
    local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = (int64_t)ppdVar1;
    if ((long)uVar2 < 1) goto LAB_01015052;
  }
  else {
    local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow =
         (int64_t)operator_new__(-(ulong)(uVar2 >> 0x3e != 0) | uVar2 * 4);
    local_108.super_TPZMatrix<double>.super_TPZBaseMatrix._24_8_ = uVar2;
  }
  piVar3 = connectorders->fStore;
  uVar7 = 0;
  do {
    *(int *)(local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + uVar7 * 4) = piVar3[uVar7]
    ;
    uVar7 = uVar7 + 1;
  } while (uVar2 != uVar7);
LAB_01015052:
  local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar2;
  TPZManVector<int,_27>::operator=(&data->fHDivConnectOrders,(TPZManVector<int,_27> *)&local_108);
  if ((double **)local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow != ppdVar1) {
    local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_108.super_TPZMatrix<double>.super_TPZBaseMatrix._26_6_ = 0;
    local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZVec_01813ef0;
    if ((double **)local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow != (double **)0x0) {
      operator_delete__((void *)local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow);
    }
  }
  TPZManVector<int,_27>::Resize(&data->fHDivNumConnectShape,1);
  iVar5 = ComputeNConnectShapeF(0,*connectorders->fStore);
  *(data->fHDivNumConnectShape).super_TPZVec<int>.fStore = iVar5;
  TPZManVector<std::pair<int,_long>,_60>::Resize(&data->fSDVecShapeIndex,(long)iVar5);
  local_108.fElem = local_78;
  local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
  local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_108.super_TPZMatrix<double>.super_TPZBaseMatrix._24_8_ =
       local_108.super_TPZMatrix<double>.super_TPZBaseMatrix._24_8_ & 0xffffffffffff0000;
  local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_108.fSize = 9;
  local_108.fGiven = local_108.fElem;
  TPZVec<int>::TPZVec(&local_108.fPivot.super_TPZVec<int>,0);
  local_108.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_108.fPivot.super_TPZVec<int>.fStore = local_108.fPivot.fExtAlloc;
  local_108.fPivot.super_TPZVec<int>.fNElements = 0;
  local_108.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_108.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_108.fWork.fStore = (double *)0x0;
  local_108.fWork.fNElements = 0;
  local_108.fWork.fNAlloc = 0;
  local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  TPZFMatrix<double>::operator=(&local_108,0.0);
  TPZMatrix<double>::Identity(&local_108.super_TPZMatrix<double>);
  if ((data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
      .fCol * (data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.
              super_TPZBaseMatrix.fRow != 9) {
    pdVar4 = (data->fMasterDirections).super_TPZFMatrix<double>.fElem;
    pdVar6 = (data->fMasterDirections).super_TPZFMatrix<double>.fGiven;
    if (pdVar4 != pdVar6 && pdVar4 != (double *)0x0) {
      operator_delete__(pdVar4);
      pdVar6 = (data->fMasterDirections).super_TPZFMatrix<double>.fGiven;
    }
    if ((pdVar6 == (double *)0x0) || ((data->fMasterDirections).super_TPZFMatrix<double>.fSize < 9))
    {
      pdVar6 = (double *)operator_new__(0x48);
    }
    (data->fMasterDirections).super_TPZFMatrix<double>.fElem = pdVar6;
  }
  (data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  fRow = 1;
  (data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  fCol = 9;
  (*(data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0xf])(&data->fMasterDirections);
  pztopology::TPZLine::ComputeHCurlDirections<double>
            (&local_108,&(data->fMasterDirections).super_TPZFMatrix<double>,
             &(data->fSideTransformationId).super_TPZVec<int>);
  ComputeVecandShape(data);
  TPZFMatrix<double>::~TPZFMatrix(&local_108,&PTR_PTR_01816200);
  return;
}

Assistant:

void TPZShapeHCurl<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                       TPZVec<int> &connectorders,
                                       TPZShapeData &data)
{
    
        
    constexpr int ncon = TSHAPE::NSides-TSHAPE::NCornerNodes;
    constexpr int NCorners = TSHAPE::NCornerNodes;
    constexpr int NSides = TSHAPE::NSides;
    if(connectorders.size() != ncon) DebugStop();
    CalcH1ShapeOrders(connectorders, data.fH1ConnectOrders);
    TPZShapeH1<TSHAPE>::Initialize(ids, data.fH1ConnectOrders, data);
    data.fSideTransformationId.Resize(NSides-NCorners, 0);
    for (int iside = NCorners; iside< NSides ; iside++) {
        int pos = iside - NCorners;
        int trans_id = TSHAPE::GetTransformId(iside, ids); // Foi criado
        data.fSideTransformationId[iside-NCorners] = trans_id;
    }

    data.fHDivConnectOrders = connectorders;

    data.fHDivNumConnectShape.Resize(ncon);
    int nShape = 0;
    for (int i = 0; i < ncon; i++)
    {
        data.fHDivNumConnectShape[i] = ComputeNConnectShapeF(i,connectorders[i]);
        nShape += data.fHDivNumConnectShape[i];
    }
    
    data.fSDVecShapeIndex.Resize(nShape);
    TPZFNMatrix<9,REAL> gradX(TSHAPE::Dimension, TSHAPE::Dimension, 0);
    gradX.Identity();

    data.fMasterDirections.Redim(TSHAPE::Dimension, 3*NSides);
    TSHAPE::ComputeHCurlDirections(gradX,data.fMasterDirections,data.fSideTransformationId);

    ComputeVecandShape(data);
}